

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O0

void mk_print(int type,char *format,...)

{
  int iVar1;
  tm *ptVar2;
  undefined1 local_b0 [8];
  tm result;
  va_list args;
  char *local_58;
  char *white_color;
  char *reset_color;
  char *bold_color;
  char *header_title;
  char *header_color;
  tm *current;
  time_t now;
  char *format_local;
  int type_local;
  
  header_title = (char *)0x0;
  bold_color = (char *)0x0;
  reset_color = "\x1b[1m";
  white_color = "\x1b[0m";
  local_58 = "\x1b[97m";
  result.tm_zone._4_4_ = 0x30;
  result.tm_zone._0_4_ = 0x10;
  switch(type) {
  case 0x1000:
    bold_color = "Info";
    header_title = "\x1b[92m";
    break;
  case 0x1001:
    bold_color = "Error";
    header_title = "\x1b[91m";
    break;
  case 0x1002:
    bold_color = "Warning";
    header_title = "\x1b[93m";
    break;
  case 0x1003:
    bold_color = " BUG !";
    header_title = "\x1b[1m\x1b[91m";
  }
  now = (time_t)format;
  format_local._4_4_ = type;
  iVar1 = isatty(1);
  if (iVar1 == 0) {
    header_title = "";
    reset_color = "";
    white_color = "";
    local_58 = "";
  }
  current = (tm *)time((time_t *)0x0);
  ptVar2 = localtime_r((time_t *)&current,(tm *)local_b0);
  printf("%s[%s%i/%02i/%02i %02i:%02i:%02i%s]%s ",reset_color,white_color,
         (ulong)(ptVar2->tm_year + 0x76c),(ulong)(ptVar2->tm_mon + 1),(ulong)(uint)ptVar2->tm_mday,
         ptVar2->tm_hour,ptVar2->tm_min,ptVar2->tm_sec,reset_color,white_color);
  printf("%s[%s%7s%s]%s ",reset_color,header_title,bold_color,local_58,white_color);
  vprintf((char *)now,&result.tm_zone);
  printf("%s\n",white_color);
  fflush(_stdout);
  return;
}

Assistant:

void mk_print(int type, const char *format, ...)
{
    time_t now;
    struct tm *current;

    const char *header_color = NULL;
    const char *header_title = NULL;
    const char *bold_color = ANSI_BOLD;
    const char *reset_color = ANSI_RESET;
    const char *white_color = ANSI_WHITE;
    va_list args;

    va_start(args, format);

    switch (type) {
    case MK_INFO:
        header_title = "Info";
        header_color = ANSI_GREEN;
        break;
    case MK_ERR:
        header_title = "Error";
        header_color = ANSI_RED;
        break;
    case MK_WARN:
        header_title = "Warning";
        header_color = ANSI_YELLOW;
        break;
    case MK_BUG:
#ifdef DEBUG
        mk_utils_stacktrace();
#endif
        header_title = " BUG !";
        header_color = ANSI_BOLD ANSI_RED;
        break;
    }

    /* Only print colors to a terminal */
    if (!isatty(STDOUT_FILENO)) {
        header_color = "";
        bold_color = "";
        reset_color = "";
        white_color = "";
    }

    now = time(NULL);
    struct tm result;
    current = localtime_r(&now, &result);
    printf("%s[%s%i/%02i/%02i %02i:%02i:%02i%s]%s ",
           bold_color, reset_color,
           current->tm_year + 1900,
           current->tm_mon + 1,
           current->tm_mday,
           current->tm_hour,
           current->tm_min,
           current->tm_sec,
           bold_color, reset_color);

    printf("%s[%s%7s%s]%s ",
           bold_color, header_color, header_title, white_color, reset_color);

    vprintf(format, args);
    va_end(args);
    printf("%s\n", reset_color);
    fflush(stdout);
}